

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calculator.h
# Opt level: O0

void __thiscall Calculator::Calculator(Calculator *this,String *e)

{
  String *ctx;
  String *e_local;
  Calculator *this_local;
  
  ctx = e;
  asl::Array<Calculator::Token>::Array(&this->_input);
  asl::Array<Calculator::Token>::Array(&this->_output);
  asl::Stack<Calculator::Token>::Stack(&this->_operators);
  asl::Stack<double>::Stack(&this->_operands);
  asl::Dic<double>::Dic(&this->_variables);
  asl::Dic<double_(*)(double)>::Dic(&this->_natfunctions);
  init(this,(EVP_PKEY_CTX *)ctx);
  parse(this,e);
  return;
}

Assistant:

Calculator(const asl::String& e) { init(); parse(e); }